

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CommsBroker_impl.hpp
# Opt level: O1

void __thiscall
helics::CommsBroker<helics::ipc::IpcComms,_helics::CoreBroker>::CommsBroker
          (CommsBroker<helics::ipc::IpcComms,_helics::CoreBroker> *this,string_view obj_name)

{
  CoreBroker::CoreBroker(&this->super_CoreBroker,obj_name);
  (this->super_CoreBroker).super_Broker._vptr_Broker = (_func_int **)&PTR__CommsBroker_0056ced8;
  (this->super_CoreBroker).super_BrokerBase._vptr_BrokerBase =
       (_func_int **)&PTR__CommsBroker_0056d030;
  (this->disconnectionStage).super___atomic_base<int>._M_i = 0;
  (this->comms)._M_t.
  super___uniq_ptr_impl<helics::ipc::IpcComms,_std::default_delete<helics::ipc::IpcComms>_>._M_t.
  super__Tuple_impl<0UL,_helics::ipc::IpcComms_*,_std::default_delete<helics::ipc::IpcComms>_>.
  super__Head_base<0UL,_helics::ipc::IpcComms_*,_false>._M_head_impl = (IpcComms *)0x0;
  (this->brokerInitialized)._M_base._M_i = false;
  loadComms(this);
  return;
}

Assistant:

CommsBroker<COMMS, BrokerT>::CommsBroker(std::string_view obj_name): BrokerT(obj_name)
{
    static_assert(std::is_base_of<CommsInterface, COMMS>::value,
                  "COMMS object must be a CommsInterface Object");
    static_assert(std::is_base_of<BrokerBase, BrokerT>::value,
                  "Broker must be an object  with a base of BrokerBase");
    loadComms();
}